

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

void cpsm::
     str_cat_impl<char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,bool args,char *args_1,unsigned_long args_2,char *args_3,
               unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8,char *args_9,unsigned_long args_10,char *args_11,
               unsigned_long args_12,char *args_13,unsigned_long args_14)

{
  bool local_31;
  
  local_31 = args;
  std::operator<<((ostream *)(ss + 0x10),*x);
  str_cat_impl<bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (ss,&local_31,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
             args_11,args_12,args_13,args_14);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}